

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp.cpp
# Opt level: O0

bool __thiscall libDAI::BP::initProps(BP *this)

{
  bool bVar1;
  unsigned_long uVar2;
  long in_RDI;
  char *__s;
  double dVar3;
  InferenceAlgorithm *in_stack_fffffffffffffda8;
  InferenceAlgorithm *in_stack_fffffffffffffdb0;
  InferenceAlgorithm *this_00;
  allocator<char> *in_stack_fffffffffffffde0;
  allocator<char> *__a;
  char *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined1 local_1a9 [40];
  allocator<char> local_181;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [39];
  undefined1 local_109 [40];
  allocator<char> local_e1;
  string local_e0 [32];
  value local_c0;
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [39];
  allocator<char> local_69;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [47];
  bool local_1;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  bVar1 = InferenceAlgorithm::HasProperty
                    (in_stack_fffffffffffffdb0,(PropertyKey *)in_stack_fffffffffffffda8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    bVar1 = InferenceAlgorithm::HasProperty
                      (in_stack_fffffffffffffdb0,(PropertyKey *)in_stack_fffffffffffffda8);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      bVar1 = InferenceAlgorithm::HasProperty
                        (in_stack_fffffffffffffdb0,(PropertyKey *)in_stack_fffffffffffffda8);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator(&local_91);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
        bVar1 = InferenceAlgorithm::HasProperty
                          (in_stack_fffffffffffffdb0,(PropertyKey *)in_stack_fffffffffffffda8);
        std::__cxx11::string::~string(local_b8);
        std::allocator<char>::~allocator(&local_b9);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
          local_c0 = (value)InferenceAlgorithm::FromStringTo<libDAI::BP::UpdateType>
                                      (in_stack_fffffffffffffda8,(PropertyKey *)0xb1e6e5);
          *(value *)(in_RDI + 0x118) = local_c0;
          std::__cxx11::string::~string(local_e0);
          std::allocator<char>::~allocator(&local_e1);
          this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_109;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (this_01,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
          __s = (char *)InferenceAlgorithm::FromStringTo<double>
                                  (in_stack_fffffffffffffdb0,
                                   (PropertyKey *)in_stack_fffffffffffffda8);
          *(char **)(in_RDI + 0x120) = __s;
          std::__cxx11::string::~string((string *)(local_109 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_109);
          __a = &local_131;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
          uVar2 = InferenceAlgorithm::FromStringTo<unsigned_long>
                            (in_stack_fffffffffffffdb0,(PropertyKey *)in_stack_fffffffffffffda8);
          *(unsigned_long *)(in_RDI + 0x128) = uVar2;
          std::__cxx11::string::~string(local_130);
          std::allocator<char>::~allocator(&local_131);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
          uVar2 = InferenceAlgorithm::FromStringTo<unsigned_long>
                            (in_stack_fffffffffffffdb0,(PropertyKey *)in_stack_fffffffffffffda8);
          *(unsigned_long *)(in_RDI + 0x130) = uVar2;
          std::__cxx11::string::~string(local_158);
          std::allocator<char>::~allocator(&local_159);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
          bVar1 = InferenceAlgorithm::HasProperty
                            (in_stack_fffffffffffffdb0,(PropertyKey *)in_stack_fffffffffffffda8);
          std::__cxx11::string::~string(local_180);
          std::allocator<char>::~allocator(&local_181);
          if (bVar1) {
            this_00 = (InferenceAlgorithm *)local_1a9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
            dVar3 = InferenceAlgorithm::FromStringTo<double>
                              (this_00,(PropertyKey *)in_stack_fffffffffffffda8);
            *(double *)(in_RDI + 0x138) = dVar3;
            std::__cxx11::string::~string((string *)(local_1a9 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_1a9);
          }
          else {
            *(undefined8 *)(in_RDI + 0x138) = 0;
          }
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool BP::initProps() {
        if( !HasProperty("updates") )
            return false;
        if( !HasProperty("tol") )
            return false;
        if( !HasProperty("maxiter") )
            return false;
        if( !HasProperty("verbose") )
            return false;
        
        Props.updates = FromStringTo<UpdateType>("updates");
        Props.tol     = FromStringTo<double>("tol");
        Props.maxiter = FromStringTo<size_t>("maxiter");
        Props.verbose = FromStringTo<size_t>("verbose");
        if( HasProperty("damping") )
            Props.damping = FromStringTo<double>("damping");
        else
            Props.damping = 0.0;

        return true;
    }